

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall QtPrivate::QPodArrayOps<char>::erase(QPodArrayOps<char> *this,char *b,qsizetype n)

{
  qsizetype *pqVar1;
  char *pcVar2;
  char *__src;
  
  __src = b + n;
  pcVar2 = (this->super_QArrayDataPointer<char>).ptr;
  if ((pcVar2 == b) && (__src != pcVar2 + (this->super_QArrayDataPointer<char>).size)) {
    (this->super_QArrayDataPointer<char>).ptr = __src;
  }
  else if (__src != pcVar2 + (this->super_QArrayDataPointer<char>).size) {
    memmove(b,__src,(long)(pcVar2 + (this->super_QArrayDataPointer<char>).size) - (long)__src);
  }
  pqVar1 = &(this->super_QArrayDataPointer<char>).size;
  *pqVar1 = *pqVar1 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }